

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBblif.c
# Opt level: O0

Abc_Ntk_t * Bbl_ManToAbc(Bbl_Man_t *p)

{
  Mem_Flex_t *pMan;
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  char *pcVar2;
  Vec_Ptr_t *p_00;
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *pFanin_00;
  Vec_Ptr_t *vCopy;
  Bbl_Obj_t *pFanin;
  Bbl_Obj_t *pObj;
  Abc_Obj_t *pObjNew;
  Abc_Ntk_t *pNtk;
  Bbl_Man_t *p_local;
  
  pNtk_00 = Abc_NtkAlloc(ABC_NTK_LOGIC,ABC_FUNC_SOP,1);
  pcVar2 = Bbl_ManName(p);
  pcVar2 = Extra_UtilStrsav(pcVar2);
  pNtk_00->pName = pcVar2;
  p_00 = Vec_PtrStart(1000);
  pFanin = Bbl_ManObjFirst(p);
  do {
    if (pFanin == (Bbl_Obj_t *)0x0) {
      for (pFanin = Bbl_ManObjFirst(p); pFanin != (Bbl_Obj_t *)0x0;
          pFanin = Bbl_ManObjNext(p,pFanin)) {
        for (vCopy = (Vec_Ptr_t *)Bbl_ObjFaninFirst(pFanin); vCopy != (Vec_Ptr_t *)0x0;
            vCopy = (Vec_Ptr_t *)Bbl_ObjFaninNext(pFanin,(Bbl_Obj_t *)vCopy)) {
          iVar1 = Bbl_ObjId(pFanin);
          pObj_00 = (Abc_Obj_t *)Vec_PtrEntry(p_00,iVar1);
          iVar1 = Bbl_ObjId((Bbl_Obj_t *)vCopy);
          pFanin_00 = (Abc_Obj_t *)Vec_PtrEntry(p_00,iVar1);
          Abc_ObjAddFanin(pObj_00,pFanin_00);
        }
      }
      Vec_PtrFree(p_00);
      Abc_NtkAddDummyPiNames(pNtk_00);
      Abc_NtkAddDummyPoNames(pNtk_00);
      iVar1 = Abc_NtkCheck(pNtk_00);
      if (iVar1 == 0) {
        printf("Bbl_ManToAbc(): Network check has failed.\n");
      }
      return pNtk_00;
    }
    iVar1 = Bbl_ObjIsInput(pFanin);
    if (iVar1 == 0) {
      iVar1 = Bbl_ObjIsOutput(pFanin);
      if (iVar1 == 0) {
        iVar1 = Bbl_ObjIsLut(pFanin);
        if (iVar1 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioReadBblif.c"
                        ,0x4a,"Abc_Ntk_t *Bbl_ManToAbc(Bbl_Man_t *)");
        }
        pObj = (Bbl_Obj_t *)Abc_NtkCreateNode(pNtk_00);
      }
      else {
        pObj = (Bbl_Obj_t *)Abc_NtkCreatePo(pNtk_00);
      }
    }
    else {
      pObj = (Bbl_Obj_t *)Abc_NtkCreatePi(pNtk_00);
    }
    iVar1 = Bbl_ObjIsLut(pFanin);
    if (iVar1 != 0) {
      pMan = (Mem_Flex_t *)pNtk_00->pManFunc;
      pcVar2 = Bbl_ObjSop(p,pFanin);
      pcVar2 = Abc_SopRegister(pMan,pcVar2);
      *(char **)&pObj[4].field_0x8 = pcVar2;
    }
    iVar1 = Bbl_ObjId(pFanin);
    Vec_PtrSetEntry(p_00,iVar1,pObj);
    pFanin = Bbl_ManObjNext(p,pFanin);
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


// For description of Binary BLIF format, refer to "abc/src/aig/bbl/bblif.h"

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Fnction*************************************************************

  Synopsis    [Constructs ABC network from the manager.]

  Description [The ABC network is started, as well as the array vCopy,
  which will map the new ID of each object in the BBLIF manager into
  the ponter ot the corresponding object in the ABC. For each internal
  node, determined by Bbl_ObjIsLut(), the SOP representation is created
  by retrieving the SOP representation of the BBLIF object. Finally,
  the objects are connected using fanin/fanout creation, and the dummy
  names are assigned because ABC requires each CI/CO to have a name.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Abc_Ntk_t * Bbl_ManToAbc( Bbl_Man_t * p )
{
    Abc_Ntk_t * pNtk;
    Abc_Obj_t * pObjNew = NULL;
    Bbl_Obj_t * pObj, * pFanin;
    Vec_Ptr_t * vCopy;
    // start the network
    pNtk = Abc_NtkAlloc( ABC_NTK_LOGIC, ABC_FUNC_SOP, 1 );
    pNtk->pName = Extra_UtilStrsav( Bbl_ManName(p) );
    // create objects
    vCopy = Vec_PtrStart( 1000 );
    Bbl_ManForEachObj( p, pObj )
    {
        if ( Bbl_ObjIsInput(pObj) )
            pObjNew = Abc_NtkCreatePi( pNtk );
        else if ( Bbl_ObjIsOutput(pObj) )
            pObjNew = Abc_NtkCreatePo( pNtk );
        else if ( Bbl_ObjIsLut(pObj) )
            pObjNew = Abc_NtkCreateNode( pNtk );
        else assert( 0 );
        if ( Bbl_ObjIsLut(pObj) )
            pObjNew->pData = Abc_SopRegister( (Mem_Flex_t *)pNtk->pManFunc, Bbl_ObjSop(p, pObj) );
        Vec_PtrSetEntry( vCopy, Bbl_ObjId(pObj), pObjNew );
    }
    // connect objects
    Bbl_ManForEachObj( p, pObj )
        Bbl_ObjForEachFanin( pObj, pFanin )
            Abc_ObjAddFanin( (Abc_Obj_t *)Vec_PtrEntry(vCopy, Bbl_ObjId(pObj)), (Abc_Obj_t *)Vec_PtrEntry(vCopy, Bbl_ObjId(pFanin)) );
    // finalize
    Vec_PtrFree( vCopy );
    Abc_NtkAddDummyPiNames( pNtk );
    Abc_NtkAddDummyPoNames( pNtk );
    if ( !Abc_NtkCheck( pNtk ) )
        printf( "Bbl_ManToAbc(): Network check has failed.\n" );
    return pNtk;
}